

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
kj::_::Deferred<kj::Function<void_()>_>::~Deferred(Deferred<kj::Function<void_()>_> *this)

{
  Deferred<kj::Function<void_()>_> *this_local;
  
  run(this);
  Maybe<kj::Function<void_()>_>::~Maybe(&this->maybeFunc);
  return;
}

Assistant:

~Deferred() noexcept(false) {
    run();
  }